

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O1

size_t TtfUtil::LocaLookup(gid16 nGlyphId,void *pLoca,size_t lLocaSize,void *pHead)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  out_of_range *this;
  ushort uVar4;
  
  uVar1 = *(ushort *)((long)pHead + 0x32);
  uVar4 = uVar1 << 8 | uVar1 >> 8;
  uVar2 = (ulong)nGlyphId;
  if (uVar4 != 1) {
    if (uVar4 != 0) goto LAB_001e27fd;
    if (uVar2 <= (lLocaSize >> 1) - 1) {
      uVar1 = *(ushort *)((long)pLoca + uVar2 * 2);
      uVar3 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) * 2;
      goto LAB_001e27f5;
    }
    if (uVar1 != 0x100) goto LAB_001e27fd;
  }
  if (uVar2 <= (lLocaSize >> 2) - 1) {
    uVar3 = *(uint *)((long)pLoca + uVar2 * 4);
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_001e27f5:
    return (ulong)uVar3;
  }
LAB_001e27fd:
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"glyph id out of range for font");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

size_t LocaLookup(gr::gid16 nGlyphId, 
		const void * pLoca, size_t lLocaSize, 
		const void * pHead)
{
	const Sfnt::FontHeader * pTable = reinterpret_cast<const Sfnt::FontHeader *>(pHead);

	// CheckTable verifies the index_to_loc_format is valid
	if (read(pTable->index_to_loc_format) == Sfnt::FontHeader::ShortIndexLocFormat)
	{ // loca entries are two bytes and have been divided by two
		if (nGlyphId <= (lLocaSize >> 1) - 1) // allow sentinel value to be accessed
		{
			const uint16 * pShortTable = reinterpret_cast<const uint16 *>(pLoca);
			return (read(pShortTable[nGlyphId]) << 1);
		}
	}
	
	if (read(pTable->index_to_loc_format) == Sfnt::FontHeader::LongIndexLocFormat)
	{ // loca entries are four bytes
		if (nGlyphId <= (lLocaSize >> 2) - 1)
		{
			const uint32 * pLongTable = reinterpret_cast<const uint32 *>(pLoca);
			return read(pLongTable[nGlyphId]);
		}
	}

	// only get here if glyph id was bad
	//return -1;
	throw std::out_of_range("glyph id out of range for font");
}